

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O2

vector<Node,_std::allocator<Node>_> *
generateRandomNodes(vector<Node,_std::allocator<Node>_> *__return_storage_ptr__,size_t n)

{
  pointer pNVar1;
  size_t i;
  size_t sVar2;
  long lVar3;
  result_type_conflict1 rVar4;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_58;
  default_random_engine generator;
  uniform_real_distribution<float> originDistribution;
  uniform_real_distribution<float> sizeDistribution;
  allocator_type local_35;
  float local_34;
  
  local_58._M_x = 1;
  generator._M_x = 0x3f80000000000000;
  originDistribution._M_param._M_a = 0.0;
  originDistribution._M_param._M_b = 0.01;
  std::vector<Node,_std::allocator<Node>_>::vector(__return_storage_ptr__,n,&local_35);
  lVar3 = 0;
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&generator,&local_58);
    *(result_type_conflict1 *)
     ((long)&(((__return_storage_ptr__->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
               super__Vector_impl_data._M_start)->box).left + lVar3) = rVar4;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&generator,&local_58);
    pNVar1 = (__return_storage_ptr__->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(result_type_conflict1 *)((long)&(pNVar1->box).top + lVar3) = rVar4;
    local_34 = *(float *)((long)&(pNVar1->box).left + lVar3);
    rVar4 = std::uniform_real_distribution<float>::operator()(&originDistribution,&local_58);
    if (1.0 - local_34 <= rVar4) {
      rVar4 = 1.0 - local_34;
    }
    pNVar1 = (__return_storage_ptr__->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(result_type_conflict1 *)((long)&(pNVar1->box).width + lVar3) = rVar4;
    local_34 = *(float *)((long)&(pNVar1->box).top + lVar3);
    rVar4 = std::uniform_real_distribution<float>::operator()(&originDistribution,&local_58);
    if (1.0 - local_34 <= rVar4) {
      rVar4 = 1.0 - local_34;
    }
    pNVar1 = (__return_storage_ptr__->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(result_type_conflict1 *)((long)&(pNVar1->box).height + lVar3) = rVar4;
    *(size_t *)((long)&pNVar1->id + lVar3) = sVar2;
    lVar3 = lVar3 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> generateRandomNodes(std::size_t n)
{
    auto generator = std::default_random_engine();
    auto originDistribution = std::uniform_real_distribution(0.0f, 1.0f);
    auto sizeDistribution = std::uniform_real_distribution(0.0f, 0.01f);
    auto nodes = std::vector<Node>(n);
    for (auto i = std::size_t(0); i < n; ++i)
    {
        nodes[i].box.left = originDistribution(generator);
        nodes[i].box.top = originDistribution(generator);
        nodes[i].box.width = std::min(1.0f - nodes[i].box.left, sizeDistribution(generator));
        nodes[i].box.height = std::min(1.0f - nodes[i].box.top, sizeDistribution(generator));
        nodes[i].id = i;
    }
    return nodes;
}